

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

uint __thiscall spv::Builder::getNumTypeConstituents(Builder *this,Id typeId)

{
  Op OVar1;
  Id id;
  uint uVar2;
  Instruction *pIVar3;
  Id lengthId;
  Instruction *instr;
  Id typeId_local;
  Builder *this_local;
  
  pIVar3 = Module::getInstruction(&this->module,typeId);
  OVar1 = spv::Instruction::getOpCode(pIVar3);
  if (2 < OVar1 - OpTypeBool) {
    if (OVar1 - OpTypeVector < 2) {
      uVar2 = spv::Instruction::getImmediateOperand(pIVar3,1);
      return uVar2;
    }
    if (OVar1 == OpTypeArray) {
LAB_006075bf:
      id = spv::Instruction::getIdOperand(pIVar3,1);
      pIVar3 = Module::getInstruction(&this->module,id);
      uVar2 = spv::Instruction::getImmediateOperand(pIVar3,0);
      return uVar2;
    }
    if (OVar1 == OpTypeStruct) {
      uVar2 = spv::Instruction::getNumOperands(pIVar3);
      return uVar2;
    }
    if (OVar1 != OpTypePointer) {
      if (OVar1 != OpTypeCooperativeMatrixKHR) {
        if (OVar1 == OpTypeCooperativeVectorNV) goto LAB_006075bf;
        if (OVar1 != OpTypeCooperativeMatrixNV) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                        ,0x579,"unsigned int spv::Builder::getNumTypeConstituents(Id) const");
        }
      }
      return 1;
    }
  }
  return 1;
}

Assistant:

unsigned int Builder::getNumTypeConstituents(Id typeId) const
{
    Instruction* instr = module.getInstruction(typeId);

    switch (instr->getOpCode())
    {
    case OpTypeBool:
    case OpTypeInt:
    case OpTypeFloat:
    case OpTypePointer:
        return 1;
    case OpTypeVector:
    case OpTypeMatrix:
        return instr->getImmediateOperand(1);
    case OpTypeCooperativeVectorNV:
    case OpTypeArray:
    {
        Id lengthId = instr->getIdOperand(1);
        return module.getInstruction(lengthId)->getImmediateOperand(0);
    }
    case OpTypeStruct:
        return instr->getNumOperands();
    case OpTypeCooperativeMatrixKHR:
    case OpTypeCooperativeMatrixNV:
        // has only one constituent when used with OpCompositeConstruct.
        return 1;
    default:
        assert(0);
        return 1;
    }
}